

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O3

void N_VAddConst_MultiFab(N_Vector x,Real b,N_Vector z)

{
  MultiFab *src;
  MultiFab *dst;
  
  src = *(MultiFab **)((long)x->content + 8);
  dst = *(MultiFab **)((long)z->content + 8);
  amrex::MultiFab::Copy
            (dst,src,0,0,(src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0);
  amrex::MultiFab::plus(dst,b,0);
  return;
}

Assistant:

void N_VAddConst_MultiFab(N_Vector x, amrex::Real b, N_Vector z)
{
    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);

    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells

    amrex::MultiFab::Copy(*mf_z, *mf_x, 0, 0, ncomp, nghost);
    mf_z->plus(b, nghost);
}